

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoAssembler.cpp
# Opt level: O1

AssemblerReturnValues __thiscall
NanoAssembler::assembleToMemory
          (NanoAssembler *this,string *inputFile,uchar **bytecodeBuffer,uint *size)

{
  pointer pcVar1;
  undefined8 uVar2;
  pointer pAVar3;
  bool bVar4;
  uchar *puVar5;
  uint uVar6;
  pointer pAVar7;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> *__range2;
  AssemblerReturnValues AVar8;
  string *this_00;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> lines;
  AssemberInstruction inst;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  labelMap;
  vector<AssemberInstruction,_std::allocator<AssemberInstruction>_> local_e8;
  uchar **local_d0;
  long *local_c8 [2];
  long local_b8 [2];
  long local_a8;
  undefined1 uStack_a0;
  undefined7 uStack_9f;
  uint uStack_98;
  undefined5 uStack_94;
  string local_88;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pcVar1 = (inputFile->_M_dataplus)._M_p;
  this_00 = &local_88;
  local_d0 = bytecodeBuffer;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this_00,pcVar1,pcVar1 + inputFile->_M_string_length);
  bVar4 = readLines((NanoAssembler *)this_00,&local_88,&local_e8,
                    (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  AVar8 = IOError;
  if (bVar4) {
    bVar4 = assemble(this,&local_e8,
                     (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)&local_68);
    pAVar3 = local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    AVar8 = AssemblerError;
    if (bVar4) {
      *size = 0;
      if (local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar7 = local_e8.
                 super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar1 = (pAVar7->line)._M_dataplus._M_p;
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,pcVar1,pcVar1 + (pAVar7->line)._M_string_length);
          local_a8 = *(long *)pAVar7->bytecode;
          uVar2 = *(undefined8 *)((long)&pAVar7->length + 1);
          uStack_98._0_1_ = (undefined1)((ulong)*(undefined8 *)(pAVar7->bytecode + 9) >> 0x38);
          uStack_98._1_3_ = (undefined3)uVar2;
          uStack_94 = (undefined5)((ulong)uVar2 >> 0x18);
          uStack_a0 = (undefined1)*(undefined8 *)(pAVar7->bytecode + 8);
          uStack_9f = (undefined7)((ulong)*(undefined8 *)(pAVar7->bytecode + 8) >> 8);
          *size = *size + uStack_98;
          if (local_c8[0] != local_b8) {
            operator_delete(local_c8[0],local_b8[0] + 1);
          }
          pAVar7 = pAVar7 + 1;
        } while (pAVar7 != pAVar3);
      }
      puVar5 = (uchar *)operator_new__((ulong)*size);
      pAVar3 = local_e8.
               super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>._M_impl
               .super__Vector_impl_data._M_finish;
      *local_d0 = puVar5;
      if (local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_e8.super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        uVar6 = 0;
        pAVar7 = local_e8.
                 super__Vector_base<AssemberInstruction,_std::allocator<AssemberInstruction>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar1 = (pAVar7->line)._M_dataplus._M_p;
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,pcVar1,pcVar1 + (pAVar7->line)._M_string_length);
          local_a8 = *(long *)pAVar7->bytecode;
          uVar2 = *(undefined8 *)((long)&pAVar7->length + 1);
          uStack_98._0_1_ = (undefined1)((ulong)*(undefined8 *)(pAVar7->bytecode + 9) >> 0x38);
          uStack_98._1_3_ = (undefined3)uVar2;
          uStack_94 = (undefined5)((ulong)uVar2 >> 0x18);
          uStack_a0 = (undefined1)*(undefined8 *)(pAVar7->bytecode + 8);
          uStack_9f = (undefined7)((ulong)*(undefined8 *)(pAVar7->bytecode + 8) >> 8);
          memcpy(*local_d0 + uVar6,&local_a8,(ulong)uStack_98);
          uVar6 = uVar6 + uStack_98;
          if (local_c8[0] != local_b8) {
            operator_delete(local_c8[0],local_b8[0] + 1);
          }
          pAVar7 = pAVar7 + 1;
        } while (pAVar7 != pAVar3);
      }
      AVar8 = Success;
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::vector<AssemberInstruction,_std::allocator<AssemberInstruction>_>::~vector(&local_e8);
  return AVar8;
}

Assistant:

AssemblerReturnValues NanoAssembler::assembleToMemory(std::string inputFile, unsigned char*& bytecodeBuffer, unsigned int& size) {
	std::vector<AssemberInstruction> lines;
	std::unordered_map<std::string, size_t> labelMap;
	// Load assembler file from disk
	if (!readLines(inputFile, lines, labelMap)) {
		return AssemblerReturnValues::IOError;
	}
	// Compile to bytecode
	if (assemble(lines, labelMap)) {
		size = 0;
		// Calculate the resulting bytecode size
		for (AssemberInstruction inst : lines) {
			size += inst.length;
		}
		// Allocate buffer to store the bytecode
		bytecodeBuffer = new unsigned char[size];
		if (bytecodeBuffer) {
			unsigned int index = 0;
			// Copy the bytecode to output buffer
			for (AssemberInstruction inst : lines) {
				memcpy(bytecodeBuffer + index, inst.bytecode, inst.length);
				index += inst.length;
			}
			return AssemblerReturnValues::Success;
		}
		return AssemblerReturnValues::MemoryAllocationError;
	}
	return AssemblerReturnValues::AssemblerError;
}